

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

tuple<std::vector<int,_std::allocator<int>_>_> *
testinator::Arbitrary<std::tuple<std::vector<int,_std::allocator<int>_>_>_>::generate_n
          (tuple<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,size_t n,
          unsigned_long randomSeed)

{
  size_t sVar1;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  anon_unknown_20::nextRandom(randomSeed);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    local_4c = detail::Arbitrary_Arithmetic<int>::generate(n,randomSeed + sVar1);
    ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_48._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<Ts...> generate_n(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate_n(n, r1),
                        Arbitrary<T>::generate_n(n, r2));
    }